

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.h
# Opt level: O1

string * __thiscall
mvm::disassembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::disassemble_abi_cxx11_
          (string *__return_storage_ptr__,
          disassembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *this)

{
  byte *pbVar1;
  string *psVar2;
  string instr;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = *(byte **)(this + 8);
  if ((*(byte **)(this + 0x10) <= pbVar1) && (pbVar1 <= *(byte **)(this + 0x18))) {
    psVar2 = (string *)(*(code *)(&DAT_0016314c + *(int *)(&DAT_0016314c + (ulong)*pbVar1 * 4)))();
    return psVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string disassembler<Set, MetaCodeImpl>::disassemble() {
  std::string prog;
  while (m_rebased_ip.assert_in_chunk()) {
    LOG_INFO("disassembler -> process instruction opcode "
             << static_cast<int>(*m_rebased_ip));

#ifdef FASTI
#define MVM_DISASSEMBLER_I(n)                                                  \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      prog.append(this->disassemble_instr<instr_type>() + "\n");               \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;

    switch (*m_rebased_ip) {
      MVM_UNROLL_256(MVM_DISASSEMBLER_I)
    default:
      throw mexcept("[-][mvm] instruction opcode overflow",
                    status_type::INSTR_OPCODE_OVERFLOW);
    }
#else
    instr_set_visitor<instr_set_desc_type>()(
        *m_rebased_ip, [this, &prog](auto &&arg) {
          using instr_type = std::decay_t<decltype(arg)>;
          prog.append(this->disassemble_instr<instr_type>() + "\n");
        });
#endif
    ++m_rebased_ip;
  }

  return prog;
}